

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.cpp
# Opt level: O0

char * findlocal(lua_State *L,CallInfo *ci,int n)

{
  int pc;
  Proto *f;
  char *pcVar1;
  StkId local_58;
  StkId limit;
  Proto *fp;
  char *name;
  int n_local;
  CallInfo *ci_local;
  lua_State *L_local;
  
  f = getluaproto(ci);
  if (f != (Proto *)0x0) {
    pc = currentpc(L,ci);
    pcVar1 = luaF_getlocalname(f,n,pc);
    if (pcVar1 != (char *)0x0) {
      return pcVar1;
    }
  }
  if (ci == L->ci) {
    local_58 = L->top;
  }
  else {
    local_58 = ci[1].func;
  }
  if (((long)local_58 - (long)ci->base >> 4 < (long)n) || (n < 1)) {
    L_local = (lua_State *)0x0;
  }
  else {
    L_local = (lua_State *)anon_var_dwarf_52f7;
  }
  return (char *)L_local;
}

Assistant:

static const char *findlocal (lua_State *L, CallInfo *ci, int n) {
  const char *name;
  Proto *fp = getluaproto(ci);
  if (fp && (name = luaF_getlocalname(fp, n, currentpc(L, ci))) != NULL)
    return name;  /* is a local variable in a Lua function */
  else {
    StkId limit = (ci == L->ci) ? L->top : (ci+1)->func;
    if (limit - ci->base >= n && n > 0)  /* is 'n' inside 'ci' stack? */
      return "(*temporary)";
    else
      return NULL;
  }
}